

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMap<unsigned_long,_const_slang::ast::ValueDriver_*,_0U>::iterator::recomputeBounds
          (iterator *this,uint32_t level)

{
  pointer pEVar1;
  long lVar2;
  ulong uVar3;
  uint32_t size;
  NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_> *this_00
  ;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  interval<unsigned_long> iVar7;
  
  uVar5 = (ulong)level;
  for (lVar6 = uVar5 << 4; lVar6 != 0; lVar6 = lVar6 + -0x10) {
    pEVar1 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar4 = (ulong)*(uint *)((long)pEVar1 + lVar6 + -4);
    lVar2 = *(long *)((long)&pEVar1[-1].node + lVar6);
    uVar3 = *(ulong *)(lVar2 + uVar4 * 8);
    this_00 = (NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
               *)(uVar3 & 0xffffffffffffffc0);
    size = ((uint)uVar3 & 0x3f) + 1;
    if (uVar5 == (int)(this->super_const_iterator).path.path.
                      super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1) {
      iVar7 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
              ::getBounds((NodeImpl<unsigned_long,_slang::IntervalMapDetails::LeafNode<unsigned_long,_const_slang::ast::ValueDriver_*,_8U,_false>_>
                           *)this_00,size);
    }
    else {
      iVar7 = IntervalMapDetails::
              NodeImpl<unsigned_long,_slang::IntervalMapDetails::BranchNode<unsigned_long,_8U,_false>_>
              ::getBounds(this_00,size);
    }
    *(interval<unsigned_long> *)(uVar4 * 0x10 + lVar2 + 0x40) = iVar7;
    uVar5 = uVar5 - 1;
  }
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::iterator::recomputeBounds(uint32_t level) {
    using namespace IntervalMapDetails;

    auto& path = this->path;
    while (level) {
        --level;
        auto offset = path.offset(level);
        interval<TKey>* key;
        NodeRef child;

        if (level == 0) {
            auto& branch = path.template node<RootBranch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }
        else {
            auto& branch = path.template node<Branch>(level);
            child = branch.childAt(offset);
            key = &branch.keyAt(offset);
        }

        auto bounds = (level == path.height() - 1)
                          ? child.template get<Leaf>().getBounds(child.size())
                          : child.template get<Branch>().getBounds(child.size());
        *key = bounds;
    }
}